

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O0

void Res_WinMarkPaths(Res_Win_t *p)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  int i;
  Abc_Obj_t *pObj;
  Res_Win_t *p_local;
  
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  Abc_NtkIncrementTravId(p->pNode->pNtk);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vLeaves), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vLeaves,local_1c);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vRoots), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(p->vRoots,local_1c);
    Res_WinMarkPaths_rec(pAVar2,p->pNode,p->nLevTravMin);
  }
  return;
}

Assistant:

void Res_WinMarkPaths( Res_Win_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // mark the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse from the roots and mark the nodes that can reach leaves
    // the nodes that do not reach leaves have previous trav ID
    // the nodes that reach leaves have current trav ID
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Res_WinMarkPaths_rec( pObj, p->pNode, p->nLevTravMin );
}